

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token_manager.cpp
# Opt level: O2

Error * __thiscall
ot::commissioner::TokenManager::ParsePrivateKey
          (Error *__return_storage_ptr__,TokenManager *this,mbedtls_pk_context_conflict *aPrivateKey
          ,ByteArray *aPrivateKeyRaw)

{
  uchar *key;
  uchar *puVar1;
  int aMbedtlsError;
  char *begin;
  char *pcVar2;
  string *this_00;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  format_args args;
  undefined1 local_98 [8];
  string local_90;
  parse_func local_70 [1];
  string local_68;
  undefined1 local_48 [40];
  
  __return_storage_ptr__->mCode = kNone;
  (__return_storage_ptr__->mMessage)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mMessage).field_2;
  (__return_storage_ptr__->mMessage)._M_string_length = 0;
  (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
  key = (aPrivateKeyRaw->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
        super__Vector_impl_data._M_start;
  puVar1 = (aPrivateKeyRaw->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  if (key == puVar1) {
    local_98._0_4_ = none_type;
    local_90._M_dataplus._M_p = "the raw private key is empty";
    local_90._M_string_length = 0x1c;
    local_90.field_2._M_allocated_capacity = 0;
    local_70[0] = (parse_func)0x0;
    pcVar2 = "the raw private key is empty";
    local_90.field_2._8_8_ =
         (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)local_98;
    while (begin = pcVar2, begin != "") {
      pcVar2 = begin + 1;
      if (*begin == '}') {
        if ((pcVar2 == "") || (*pcVar2 != '}')) {
          ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
        }
        pcVar2 = begin + 2;
      }
      else if (*begin == '{') {
        pcVar2 = ::fmt::v10::detail::
                 parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                           (begin,"",(format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      *)local_98);
      }
    }
    args.field_1.args_ = in_R9.args_;
    args.desc_ = (unsigned_long_long)local_98;
    ::fmt::v10::vformat_abi_cxx11_
              (&local_68,(v10 *)"the raw private key is empty",(string_view)ZEXT816(0x1c),args);
    local_48._0_4_ = kInvalidArgs;
    std::__cxx11::string::string((string *)(local_48 + 8),(string *)&local_68);
    Error::operator=(__return_storage_ptr__,(Error *)local_48);
    std::__cxx11::string::~string((string *)(local_48 + 8));
    this_00 = &local_68;
  }
  else {
    aMbedtlsError =
         mbedtls_pk_parse_key
                   ((mbedtls_pk_context *)aPrivateKey,key,(long)puVar1 - (long)key,(uchar *)0x0,0,
                    mbedtls_ctr_drbg_random,&this->mCtrDrbg);
    if (aMbedtlsError == 0) {
      return __return_storage_ptr__;
    }
    ErrorFromMbedtlsError((Error *)local_98,aMbedtlsError);
    Error::operator=(__return_storage_ptr__,(Error *)local_98);
    std::__cxx11::string::~string((string *)(local_98 + 8));
    local_98._0_4_ = uint_type;
    this_00 = (string *)(local_98 + 8);
    std::__cxx11::string::string((string *)this_00,(string *)&__return_storage_ptr__->mMessage);
    Error::operator=(__return_storage_ptr__,(Error *)local_98);
  }
  std::__cxx11::string::~string((string *)this_00);
  return __return_storage_ptr__;
}

Assistant:

Error TokenManager::ParsePrivateKey(mbedtls_pk_context &aPrivateKey, const ByteArray &aPrivateKeyRaw)
{
    Error error;

    VerifyOrExit(!aPrivateKeyRaw.empty(), error = ERROR_INVALID_ARGS("the raw private key is empty"));
    if (int fail = mbedtls_pk_parse_key(&aPrivateKey, aPrivateKeyRaw.data(), aPrivateKeyRaw.size(), nullptr, 0,
                                        mbedtls_ctr_drbg_random, &mCtrDrbg))
    {
        error = ErrorFromMbedtlsError(fail);
        ExitNow(error = {ErrorCode::kInvalidArgs, error.GetMessage()});
    }

exit:
    return error;
}